

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_search.cpp
# Opt level: O3

void __thiscall LoopSearch::build_map(LoopSearch *this)

{
  key_type pFVar1;
  _Rb_tree<Loop_*,_Loop_*,_std::_Identity<Loop_*>,_std::less<Loop_*>,_std::allocator<Loop_*>_> *__x;
  Loop *pLVar2;
  mapped_type *ppLVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  BasicBlock *bb;
  map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
  _sub_map;
  BasicBlock *local_c8;
  _List_node_base *local_c0;
  map<Function_*,_std::set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_>,_std::less<Function_*>,_std::allocator<std::pair<Function_*const,_std::set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_>_>_>_>
  *local_b8;
  key_type local_b0;
  _List_node_base local_a8;
  _Rb_tree<BasicBlock_*,_std::pair<BasicBlock_*const,_Loop_*>,_std::_Select1st<std::pair<BasicBlock_*const,_Loop_*>_>,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
  local_90;
  _Rb_tree<Loop_*,_Loop_*,_std::_Identity<Loop_*>,_std::less<Loop_*>,_std::allocator<Loop_*>_>
  local_60;
  
  Module::get_functions_abi_cxx11_
            ((list<Function_*,_std::allocator<Function_*>_> *)&local_a8,(this->super_Pass).m_);
  if (local_a8._M_next != &local_a8) {
    local_b8 = &this->fun_loop;
    p_Var4 = local_a8._M_next;
    do {
      pFVar1 = (key_type)p_Var4[1]._M_next;
      p_Var5 = (pFVar1->basic_blocks_).super__List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var5 != (_List_node_base *)&pFVar1->basic_blocks_) {
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c0 = p_Var4;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_c8 = (BasicBlock *)p_Var5[1]._M_next;
          local_b0 = pFVar1;
          __x = &std::
                 map<Function_*,_std::set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_>,_std::less<Function_*>,_std::allocator<std::pair<Function_*const,_std::set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_>_>_>_>
                 ::operator[](local_b8,&local_b0)->_M_t;
          std::
          _Rb_tree<Loop_*,_Loop_*,_std::_Identity<Loop_*>,_std::less<Loop_*>,_std::allocator<Loop_*>_>
          ::_Rb_tree(&local_60,__x);
          pLVar2 = get_inner_loop(this,(set<Loop_*,_std::less<Loop_*>,_std::allocator<Loop_*>_> *)
                                       &local_60,local_c8);
          ppLVar3 = std::
                    map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
                    ::operator[]((map<BasicBlock_*,_Loop_*,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
                                  *)&local_90,&local_c8);
          *ppLVar3 = pLVar2;
          std::
          _Rb_tree<Loop_*,_Loop_*,_std::_Identity<Loop_*>,_std::less<Loop_*>,_std::allocator<Loop_*>_>
          ::~_Rb_tree(&local_60);
          p_Var5 = p_Var5->_M_next;
        } while (p_Var5 != (_List_node_base *)&pFVar1->basic_blocks_);
        std::
        _Rb_tree<BasicBlock_*,_std::pair<BasicBlock_*const,_Loop_*>,_std::_Select1st<std::pair<BasicBlock_*const,_Loop_*>_>,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_Loop_*>_>_>
        ::~_Rb_tree(&local_90);
        p_Var4 = local_c0;
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != &local_a8);
  }
  while (local_a8._M_next != &local_a8) {
    p_Var4 = (((_List_base<Function_*,_std::allocator<Function_*>_> *)&(local_a8._M_next)->_M_next)
             ->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_a8._M_next);
    local_a8._M_next = p_Var4;
  }
  return;
}

Assistant:

void LoopSearch::build_map() {
    for (auto f: m_->get_functions()) {
        if (f->is_declaration()) continue;
        std::map<BasicBlock *, Loop *> _sub_map;
        for (auto bb: f->get_basic_blocks()) {
            _sub_map[bb] = get_inner_loop(get_loop(f), bb);
        }
    }
}